

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int __thiscall geemuboi::core::CPU::add_a_l(CPU *this)

{
  CPU *this_local;
  
  add_r8_r8(this,&this->regs->a,this->regs->l);
  return 1;
}

Assistant:

int CPU::add_a_l() {
    add_r8_r8(regs.a, regs.l);
    return 1;
}